

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::formatReconstructedExpression(Catch *this,ostream *os,string *lhs,StringRef op,string *rhs)

{
  size_t __n;
  size_t __n_00;
  void *pvVar1;
  void *pvVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  size_type __size;
  char *pcVar5;
  size_type __size_1;
  
  puVar4 = (undefined8 *)op.m_size;
  __n = *(size_t *)(os + 8);
  __n_00 = puVar4[1];
  if (__n_00 + __n < 0x28) {
    if (__n != 0) {
      pvVar1 = *(void **)os;
      pvVar2 = memchr(pvVar1,10,__n);
      if (pvVar2 != (void *)0x0 && (long)pvVar2 - (long)pvVar1 != -1) goto LAB_0011e343;
    }
    pcVar5 = " ";
    if (__n_00 == 0) goto LAB_0011e34a;
    pvVar1 = (void *)*puVar4;
    pvVar2 = memchr(pvVar1,10,__n_00);
    if ((long)pvVar2 - (long)pvVar1 == -1 || pvVar2 == (void *)0x0) goto LAB_0011e34a;
  }
LAB_0011e343:
  pcVar5 = "\n";
LAB_0011e34a:
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,*(char **)os,__n);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,1);
  poVar3 = (ostream *)std::ostream::write((char *)poVar3,(long)lhs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)*puVar4,puVar4[1]);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }